

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::remove_clipboard_notify(Fl_Clipboard_Notify_Handler h)

{
  Clipboard_Notify *pCVar1;
  Clipboard_Notify **ppCVar2;
  Clipboard_Notify **ppCVar3;
  
  ppCVar2 = &clip_notify_list;
  do {
    ppCVar3 = ppCVar2;
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Clipboard_Notify *)0x0) {
      return;
    }
    ppCVar2 = &pCVar1->next;
  } while (pCVar1->handler != h);
  *ppCVar3 = pCVar1->next;
  operator_delete(pCVar1,0x18);
  fl_clipboard_notify_change();
  return;
}

Assistant:

void Fl::remove_clipboard_notify(Fl_Clipboard_Notify_Handler h) {
  struct Clipboard_Notify *node, **prev;

  node = clip_notify_list;
  prev = &clip_notify_list;
  while (node != NULL) {
    if (node->handler == h) {
      *prev = node->next;
      delete node;

      fl_clipboard_notify_change();

      return;
    }

    prev = &node->next;
    node = node->next;
  }
}